

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_definition.cpp
# Opt level: O1

void duckdb::InnerGetListOfDependencies
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *dependencies)

{
  undefined1 uVar1;
  undefined1 uVar2;
  pointer pcVar3;
  undefined8 uVar4;
  ColumnRefExpression *pCVar5;
  string *__x;
  ColumnRefExpression columnref;
  _Any_data local_88;
  _Alloc_hider local_78;
  code *pcStack_70;
  char local_68 [16];
  optional_idx local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50 [32];
  
  if ((expr->super_BaseExpression).type == COLUMN_REF) {
    pCVar5 = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    uVar4 = local_88._8_8_;
    local_88._M_unused._M_object = &PTR__BaseExpression_0247c430;
    uVar1 = (pCVar5->super_ParsedExpression).super_BaseExpression.type;
    uVar2 = (pCVar5->super_ParsedExpression).super_BaseExpression.expression_class;
    local_88._M_pod_data[9] = uVar2;
    local_88._M_pod_data[8] = uVar1;
    local_88._10_6_ = SUB86(uVar4,2);
    pcVar3 = (pCVar5->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
    local_78._M_p = local_68;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,
               pcVar3 + (pCVar5->super_ParsedExpression).super_BaseExpression.alias._M_string_length
              );
    local_58.index = (pCVar5->super_ParsedExpression).super_BaseExpression.query_location.index;
    local_88._M_unused._M_object = &PTR__ColumnRefExpression_024992f0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_50,&(pCVar5->column_names).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    __x = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)&local_88);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)dependencies,__x);
    local_88._M_unused._M_object = &PTR__ColumnRefExpression_024992f0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_50);
    local_88._M_unused._M_object = &PTR__BaseExpression_0247c430;
    if (local_78._M_p != local_68) {
      operator_delete(local_78._M_p);
    }
  }
  pcStack_70 = ::std::
               _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/column_definition.cpp:143:52)>
               ::_M_invoke;
  local_78._M_p =
       (pointer)::std::
                _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/parser/column_definition.cpp:143:52)>
                ::_M_manager;
  local_88._M_unused._M_object = expr;
  local_88._8_8_ = dependencies;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::ParsedExpression_&)> *)&local_88);
  if ((code *)local_78._M_p != (code *)0x0) {
    (*(code *)local_78._M_p)(&local_88,&local_88,3);
  }
  return;
}

Assistant:

static void InnerGetListOfDependencies(ParsedExpression &expr, vector<string> &dependencies) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto columnref = expr.Cast<ColumnRefExpression>();
		auto &name = columnref.GetColumnName();
		dependencies.push_back(name);
	}
	ParsedExpressionIterator::EnumerateChildren(expr, [&](const ParsedExpression &child) {
		if (expr.GetExpressionType() == ExpressionType::LAMBDA) {
			throw NotImplementedException("Lambda functions are currently not supported in generated columns.");
		}
		InnerGetListOfDependencies((ParsedExpression &)child, dependencies);
	});
}